

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O0

void pubkeyExceptionTest(string *hex)

{
  bool bVar1;
  AssertHelper local_d0;
  Message local_c8 [2];
  CfdException *anon_var_0_1;
  Pubkey local_a0;
  byte local_81;
  char *pcStack_80;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_70 [2];
  CfdException *anon_var_0;
  Pubkey local_58;
  byte local_3d;
  bool gtest_caught_expected;
  ConstCharPtr local_30;
  ConstCharPtr gtest_msg;
  Pubkey pubkey;
  string *hex_local;
  
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_30,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_30);
  if (bVar1) {
    local_3d = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Pubkey::Pubkey(&local_58,hex);
      cfd::core::Pubkey::operator=((Pubkey *)&gtest_msg,&local_58);
      cfd::core::Pubkey::~Pubkey(&local_58);
    }
    if ((local_3d & 1) == 0) {
      local_30.value =
           "Expected: (pubkey = Pubkey(hex)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002cf99e;
    }
  }
  else {
LAB_002cf99e:
    testing::Message::Message(local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,99,local_30.value);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_70);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff80);
  if (bVar1) {
    local_81 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData::ByteData((ByteData *)&anon_var_0_1,hex);
      cfd::core::Pubkey::Pubkey(&local_a0,(ByteData *)&anon_var_0_1);
      cfd::core::Pubkey::operator=((Pubkey *)&gtest_msg,&local_a0);
      cfd::core::Pubkey::~Pubkey(&local_a0);
      cfd::core::ByteData::~ByteData((ByteData *)&anon_var_0_1);
    }
    if ((local_81 & 1) != 0) goto LAB_002cfbe9;
    pcStack_80 = 
    "Expected: (pubkey = Pubkey(ByteData(hex))) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
             ,100,pcStack_80);
  testing::internal::AssertHelper::operator=(&local_d0,local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  testing::Message::~Message(local_c8);
LAB_002cfbe9:
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_msg);
  return;
}

Assistant:

void pubkeyExceptionTest(std::string hex) {
  Pubkey pubkey;
  EXPECT_THROW((pubkey = Pubkey(hex)), CfdException);
  EXPECT_THROW((pubkey = Pubkey(ByteData(hex))), CfdException);
}